

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

int LLGetBits(uint8_t *data,size_t data_size,size_t nb,int *val,uint64_t *bit_pos)

{
  ulong uVar1;
  int bit;
  uint64_t p;
  uint32_t i;
  uint64_t *bit_pos_local;
  int *val_local;
  size_t nb_local;
  size_t data_size_local;
  uint8_t *data_local;
  
  i = 0;
  *val = 0;
  while( true ) {
    if (nb <= i) {
      return 1;
    }
    uVar1 = *bit_pos;
    *bit_pos = uVar1 + 1;
    if (data_size <= uVar1 >> 3) break;
    *val = *val | (uint)(((uint)data[uVar1 >> 3] & 1 << ((byte)uVar1 & 7)) != 0) << ((byte)i & 0x1f)
    ;
    i = i + 1;
  }
  return 0;
}

Assistant:

static int LLGetBits(const uint8_t* const data, size_t data_size, size_t nb,
                     int* val, uint64_t* const bit_pos) {
  uint32_t i = 0;
  *val = 0;
  while (i < nb) {
    const uint64_t p = (*bit_pos)++;
    if ((p >> 3) >= data_size) {
      return 0;
    } else {
      const int bit = !!(data[p >> 3] & (1 << ((p & 7))));
      *val = *val | (bit << i);
      ++i;
    }
  }
  return 1;
}